

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::gotSignal(UnixEventPort *this,siginfo_t *siginfo)

{
  PromiseFulfiller<siginfo_t> *pPVar1;
  SignalPromiseAdapter *pSVar2;
  SignalPromiseAdapter *pSVar3;
  long lVar4;
  SignalPromiseAdapter ***pppSVar5;
  siginfo_t *psVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined8 auStack_98 [16];
  
  bVar8 = 0;
  if (((this->childSet).ptr.ptr != (ChildSet *)0x0) && (siginfo->si_signo == 0x11)) {
    ChildSet::checkExits((this->childSet).ptr.ptr);
    return;
  }
  pSVar3 = this->signalHead;
  while (pSVar3 != (SignalPromiseAdapter *)0x0) {
    if (pSVar3->signum == siginfo->si_signo) {
      pPVar1 = pSVar3->fulfiller;
      psVar6 = siginfo;
      puVar7 = auStack_98;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *(undefined8 *)psVar6;
        psVar6 = (siginfo_t *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,auStack_98);
      pSVar2 = pSVar3->next;
      if (pSVar2 == (SignalPromiseAdapter *)0x0) {
        pppSVar5 = &pSVar3->loop->signalTail;
      }
      else {
        pppSVar5 = &pSVar2->prev;
      }
      *pppSVar5 = pSVar3->prev;
      *pSVar3->prev = pSVar2;
      pSVar3->next = (SignalPromiseAdapter *)0x0;
      pSVar3->prev = (SignalPromiseAdapter **)0x0;
      pSVar3 = pSVar2;
    }
    else {
      pSVar3 = pSVar3->next;
    }
  }
  return;
}

Assistant:

void UnixEventPort::gotSignal(const siginfo_t& siginfo) {
  // If onChildExit() has been called and this is SIGCHLD, check for child exits.
  KJ_IF_SOME(cs, childSet) {
    if (siginfo.si_signo == SIGCHLD) {
      cs->checkExits();
      return;
    }
  }

  // Fire any events waiting on this signal.
  auto ptr = signalHead;
  while (ptr != nullptr) {
    if (ptr->signum == siginfo.si_signo) {
      ptr->fulfiller.fulfill(kj::cp(siginfo));
      ptr = ptr->removeFromList();
    } else {
      ptr = ptr->next;
    }
  }
}